

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_dictionary.cpp
# Opt level: O1

int duckdb_brotli::BrotliSharedDictionaryAttach
              (BrotliSharedDictionaryInternal *dict,BrotliSharedDictionaryType type,size_t data_size
              ,uint8_t *data)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  
  iVar2 = 0;
  if (type == BROTLI_SHARED_DICTIONARY_RAW && dict != (BrotliSharedDictionaryInternal *)0x0) {
    uVar1 = dict->num_prefix;
    uVar3 = (ulong)uVar1;
    if (uVar3 < 0xf) {
      dict->prefix_size[uVar3] = data_size;
      dict->prefix[uVar3] = data;
      dict->num_prefix = uVar1 + 1;
      iVar2 = 1;
    }
  }
  return iVar2;
}

Assistant:

BROTLI_BOOL duckdb_brotli::BrotliSharedDictionaryAttach(
    BrotliSharedDictionary* dict, BrotliSharedDictionaryType type,
    size_t data_size, const uint8_t data[BROTLI_ARRAY_PARAM(data_size)]) {
  if (!dict) {
    return BROTLI_FALSE;
  }
#if defined(BROTLI_EXPERIMENTAL)
  if (type == BROTLI_SHARED_DICTIONARY_SERIALIZED) {
    return DecodeSharedDictionary(data, data_size, dict);
  }
#endif  /* BROTLI_EXPERIMENTAL */
  if (type == BROTLI_SHARED_DICTIONARY_RAW) {
    if (dict->num_prefix >= SHARED_BROTLI_MAX_COMPOUND_DICTS) {
      return BROTLI_FALSE;
    }
    dict->prefix_size[dict->num_prefix] = data_size;
    dict->prefix[dict->num_prefix] = data;
    dict->num_prefix++;
    return BROTLI_TRUE;
  }
  return BROTLI_FALSE;
}